

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedListPool.h
# Opt level: O0

void __thiscall
LinkedListPool<depspawn::internal::Workitem::_dep,_true,_false>::allocate
          (LinkedListPool<depspawn::internal::Workitem::_dep,_true,_false> *this)

{
  char cVar1;
  int iVar2;
  int iVar3;
  vector_t *pvVar4;
  LinkedListPool<depspawn::internal::Workitem::_dep,_true,_false> *this_00;
  _dep *last_datain;
  _dep *in_RDI;
  _dep *p;
  _dep *q;
  _dep *h;
  char *endptr;
  char *baseptr;
  memory_order __b;
  _dep **__x;
  LinkedListPool<depspawn::internal::Workitem::_dep,_true,_false> *local_30;
  
  this_00 = (LinkedListPool<depspawn::internal::Workitem::_dep,_true,_false> *)
            PoolAllocator_malloc_free<false>::malloc
                      ((long)(*(int *)&in_RDI[1].next * *(int *)((long)&in_RDI[1].next + 4)));
  iVar2 = *(int *)((long)&in_RDI[1].next + 4);
  iVar3 = *(int *)&in_RDI[1].next;
  pvVar4 = &this_00->v_;
  local_30 = this_00;
  do {
    local_30 = (LinkedListPool<depspawn::internal::Workitem::_dep,_true,_false> *)
               ((long)&(local_30->v_).
                       super__Vector_base<depspawn::internal::Workitem::_dep_*,_std::allocator<depspawn::internal::Workitem::_dep_*>_>
                       ._M_impl.super__Vector_impl_data._M_start +
               (long)*(int *)((long)&in_RDI[1].next + 4));
    memset(this_00,0,0x10);
    (this_00->v_).
    super__Vector_base<depspawn::internal::Workitem::_dep_*,_std::allocator<depspawn::internal::Workitem::_dep_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_30;
    this_00 = (LinkedListPool<depspawn::internal::Workitem::_dep,_true,_false> *)
              (this_00->v_).
              super__Vector_base<depspawn::internal::Workitem::_dep_*,_std::allocator<depspawn::internal::Workitem::_dep_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  } while (local_30 <=
           (LinkedListPool<depspawn::internal::Workitem::_dep,_true,_false> *)
           ((long)&(pvVar4->
                   super__Vector_base<depspawn::internal::Workitem::_dep_*,_std::allocator<depspawn::internal::Workitem::_dep_*>_>
                   )._M_impl.super__Vector_impl_data._M_start + (long)(iVar2 * (iVar3 + -1))));
  do {
    __x = &in_RDI[2].next;
    last_datain = (_dep *)0x1;
    LOCK();
    cVar1 = *(char *)__x;
    *(undefined1 *)__x = 1;
    UNLOCK();
  } while (cVar1 != '\0');
  std::
  vector<depspawn::internal::Workitem::_dep_*,_std::allocator<depspawn::internal::Workitem::_dep_*>_>
  ::push_back((vector<depspawn::internal::Workitem::_dep_*,_std::allocator<depspawn::internal::Workitem::_dep_*>_>
               *)0x1,__x);
  freeLinkedList(this_00,in_RDI,last_datain,SUB81((ulong)__x >> 0x38,0));
  std::operator&(memory_order_release,__memory_order_mask);
  *(undefined1 *)&in_RDI[2].next = 0;
  return;
}

Assistant:

void allocate() {
    char * baseptr = PoolAllocator_malloc_free<SCALABLE>::malloc(chunkSize_ * minTSize_);
    char * const endptr = baseptr +  minTSize_ * (chunkSize_ - 1);
    T * const h = reinterpret_cast<T *>(baseptr);
    T * const q = reinterpret_cast<T *>(endptr);
    T * p = h;
    do {
      baseptr += minTSize_;
      if (ALLOC_ONCE) {
        new (p) T();
      }
      p->next = reinterpret_cast<T *>(baseptr); //invalid for p=q. Will be corrected during linking
      p = static_cast<T *>(p->next);
    } while (baseptr <= endptr);
    
    while (pool_mutex_.test_and_set(std::memory_order_acquire));
    
    v_.push_back(h);

    freeLinkedList(h, q, true);
    
    pool_mutex_.clear(std::memory_order_release);
  }